

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToFile
          (TinyGLTF *this,Model *model,string *filename,bool embedImages,bool embedBuffers,
          bool prettyPrint,bool writeBinary)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  string local_298;
  string local_278;
  undefined1 local_258 [8];
  json image;
  undefined1 local_240 [4];
  uint i_1;
  json images;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  reference local_1a8;
  string *usedName;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  int numUsed;
  bool inUse;
  undefined1 local_160 [8];
  string binUri;
  string binSavePath;
  json buffer;
  undefined1 local_108 [4];
  uint i;
  json buffers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedUris;
  string baseDir;
  size_type pos;
  undefined1 local_90 [8];
  string defaultBinFileExt;
  undefined1 local_60 [8];
  string defaultBinFilename;
  JsonDocument output;
  bool writeBinary_local;
  bool prettyPrint_local;
  bool embedBuffers_local;
  bool embedImages_local;
  string *filename_local;
  Model *model_local;
  TinyGLTF *this_local;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)((long)&defaultBinFilename.field_2 + 8),(nullptr_t)0x0);
  GetBaseFilename((string *)local_60,filename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_90,".bin",(allocator *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  std::__cxx11::string::length();
  lVar4 = std::__cxx11::string::rfind((char)local_60,0x2e);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)((long)&baseDir.field_2 + 8),(ulong)local_60);
    std::__cxx11::string::operator=((string *)local_60,(string *)(baseDir.field_2._M_local_buf + 8))
    ;
    std::__cxx11::string::~string((string *)(baseDir.field_2._M_local_buf + 8));
  }
  GetBaseDir((string *)
             &usedUris.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,filename);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)
               &usedUris.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"./");
  }
  SerializeGltfModel(model,(json *)((long)&defaultBinFilename.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&buffers.m_value);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_108,(nullptr_t)0x0);
  sVar6 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::size(&model->buffers);
  anon_unknown_57::JsonReserveArray
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_108,sVar6);
  for (buffer.m_value.number_integer._4_4_ = 0;
      sVar6 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::size
                        (&model->buffers), (uint)buffer.m_value.number_unsigned._4_4_ < sVar6;
      buffer.m_value.number_integer._4_4_ = buffer.m_value.number_integer._4_4_ + 1) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)((long)&binSavePath.field_2 + 8),(nullptr_t)0x0);
    if (embedBuffers) {
      pvVar7 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                         (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
      SerializeGltfBuffer(pvVar7,(json *)((long)&binSavePath.field_2 + 8));
LAB_00524e73:
      anon_unknown_57::JsonPushBack((json *)local_108,(json *)((long)&binSavePath.field_2 + 8));
      images.m_value.number_integer._4_4_ = 0;
    }
    else {
      std::__cxx11::string::string((string *)(binUri.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_160);
      std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pvVar7 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                           (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
        bVar1 = IsDataURI(&pvVar7->uri);
        if (bVar1) goto LAB_00524ba8;
        pvVar7 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                           (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
        std::__cxx11::string::operator=((string *)local_160,(string *)&pvVar7->uri);
      }
      else {
LAB_00524ba8:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numUsed
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
        std::__cxx11::string::operator=((string *)local_160,(string *)&numUsed);
        std::__cxx11::string::~string((string *)&numUsed);
        bVar1 = true;
        __range5._0_4_ = 0;
LAB_00524bf1:
        if (bVar1) {
          bVar1 = false;
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&buffers.m_value);
          usedName = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&buffers.m_value);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&usedName), bVar2) {
            local_1a8 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end5);
            iVar3 = std::__cxx11::string::compare((string *)local_160);
            if (iVar3 == 0) {
              bVar1 = true;
              std::__cxx11::to_string(&local_208,(int)__range5);
              std::operator+(&local_1e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_60,&local_208);
              std::operator+(&local_1c8,&local_1e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
              std::__cxx11::string::operator=((string *)local_160,(string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_208);
              __range5._0_4_ = (int)__range5 + 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          goto LAB_00524bf1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&buffers.m_value,(value_type *)local_160);
      JoinPath(&local_228,
               (string *)
               &usedUris.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_160);
      std::__cxx11::string::operator=
                ((string *)(binUri.field_2._M_local_buf + 8),(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      pvVar7 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                         (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
      bVar1 = SerializeGltfBuffer(pvVar7,(json *)((long)&binSavePath.field_2 + 8),
                                  (string *)(binUri.field_2._M_local_buf + 8),(string *)local_160);
      if (!bVar1) {
        this_local._7_1_ = 0;
      }
      images.m_value.number_integer._5_3_ = 0;
      images.m_value.number_integer._4_1_ = !bVar1;
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string((string *)(binUri.field_2._M_local_buf + 8));
      if (images.m_value.number_integer._4_4_ == 0) goto LAB_00524e73;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)((long)&binSavePath.field_2 + 8));
    if (images.m_value.number_integer._4_4_ != 0) goto LAB_0052516f;
  }
  anon_unknown_57::JsonAddMember
            ((json *)((long)&defaultBinFilename.field_2 + 8),"buffers",(json *)local_108);
  sVar6 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images);
  if (sVar6 != 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_240,(nullptr_t)0x0);
    sVar6 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images);
    anon_unknown_57::JsonReserveArray
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_240,sVar6);
    for (image.m_value.number_integer._4_4_ = 0;
        uVar5 = (ulong)(uint)image.m_value.number_unsigned._4_4_,
        sVar6 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images)
        , uVar5 < sVar6; image.m_value.number_integer._4_4_ = image.m_value.number_integer._4_4_ + 1
        ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_258,(nullptr_t)0x0);
      pvVar8 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                         (&model->images,(ulong)(uint)image.m_value.number_unsigned._4_4_);
      UpdateImageObject(pvVar8,(string *)
                               &usedUris.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        image.m_value.number_integer._4_4_,embedImages,&this->WriteImageData,
                        this->write_image_user_data_);
      pvVar8 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                         (&model->images,(ulong)(uint)image.m_value.number_unsigned._4_4_);
      SerializeGltfImage(pvVar8,(json *)local_258);
      anon_unknown_57::JsonPushBack((json *)local_240,(json *)local_258);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_258);
    }
    anon_unknown_57::JsonAddMember
              ((json *)((long)&defaultBinFilename.field_2 + 8),"images",(json *)local_240);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_240);
  }
  if (writeBinary) {
    anon_unknown_57::JsonToString(&local_278,(json *)((long)&defaultBinFilename.field_2 + 8),-1);
    WriteBinaryGltfFile(filename,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
  }
  else {
    anon_unknown_57::JsonToString
              (&local_298,(json *)((long)&defaultBinFilename.field_2 + 8),(prettyPrint & 1) - 1 | 2)
    ;
    WriteGltfFile(filename,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
  }
  this_local._7_1_ = 1;
  images.m_value.number_integer._4_4_ = 1;
LAB_0052516f:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&buffers.m_value);
  std::__cxx11::string::~string
            ((string *)
             &usedUris.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)((long)&defaultBinFilename.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TinyGLTF::WriteGltfSceneToFile(Model *model, const std::string &filename,
                                    bool embedImages = false,
                                    bool embedBuffers = false,
                                    bool prettyPrint = true,
                                    bool writeBinary = false) {
  JsonDocument output;
  std::string defaultBinFilename = GetBaseFilename(filename);
  std::string defaultBinFileExt = ".bin";
  std::string::size_type pos =
      defaultBinFilename.rfind('.', defaultBinFilename.length());

  if (pos != std::string::npos) {
    defaultBinFilename = defaultBinFilename.substr(0, pos);
  }
  std::string baseDir = GetBaseDir(filename);
  if (baseDir.empty()) {
    baseDir = "./";
  }
  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedUris;
  json buffers;
  JsonReserveArray(buffers, model->buffers.size());
  for (unsigned int i = 0; i < model->buffers.size(); ++i) {
    json buffer;
    if (embedBuffers) {
      SerializeGltfBuffer(model->buffers[i], buffer);
    } else {
      std::string binSavePath;
      std::string binUri;
      if (!model->buffers[i].uri.empty() && !IsDataURI(model->buffers[i].uri)) {
        binUri = model->buffers[i].uri;
      } else {
        binUri = defaultBinFilename + defaultBinFileExt;
        bool inUse = true;
        int numUsed = 0;
        while (inUse) {
          inUse = false;
          for (const std::string &usedName : usedUris) {
            if (binUri.compare(usedName) != 0) continue;
            inUse = true;
            binUri = defaultBinFilename + std::to_string(numUsed++) +
                     defaultBinFileExt;
            break;
          }
        }
      }
      usedUris.push_back(binUri);
      binSavePath = JoinPath(baseDir, binUri);
      if (!SerializeGltfBuffer(model->buffers[i], buffer, binSavePath,
                               binUri)) {
        return false;
      }
    }
    JsonPushBack(buffers, std::move(buffer));
  }
  JsonAddMember(output, "buffers", std::move(buffers));

  // IMAGES
  if (model->images.size()) {
    json images;
    JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      json image;

      UpdateImageObject(model->images[i], baseDir, int(i), embedImages,
                        &this->WriteImageData, this->write_image_user_data_);
      SerializeGltfImage(model->images[i], image);
      JsonPushBack(images, std::move(image));
    }
    JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    WriteBinaryGltfFile(filename, JsonToString(output));
  } else {
    WriteGltfFile(filename, JsonToString(output, (prettyPrint ? 2 : -1)));
  }

  return true;
}